

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O3

bool slang::ast::OpInfo::isLValue(UnaryOperator op)

{
  return op - Preincrement < 4;
}

Assistant:

bool OpInfo::isLValue(UnaryOperator op) {
    switch (op) {
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            return true;
        default:
            return false;
    }
}